

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

Mesh * vera::sphereHalfMesh(Mesh *__return_storage_ptr__,int _resolution,float _radius)

{
  double dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  vec2 tcoord;
  float local_a8;
  undefined8 local_78;
  float local_70;
  float local_68;
  float local_64;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_60;
  float local_5c;
  undefined1 local_58 [16];
  float local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  local_48 = _radius;
  Mesh::Mesh(__return_storage_ptr__);
  fVar2 = (float)_resolution;
  fVar8 = fVar2 * 0.5;
  local_64 = (float)(_resolution + 1);
  fVar3 = fVar2 + fVar2;
  if (fVar8 < local_64) {
    local_68 = 3.1415927 / (float)_resolution;
    local_38 = local_48;
    fStack_34 = local_48;
    fStack_30 = local_48;
    fStack_2c = local_48;
    fVar4 = fVar8;
    do {
      local_58._0_4_ = fVar4;
      dVar9 = 3.141592653589793 - (double)(fVar4 * local_68);
      dVar1 = sin(dVar9);
      dVar9 = cos(dVar9);
      local_5c = 1.0 - (float)local_58._0_4_ / fVar2;
      if (0.0 <= fVar3) {
        fVar4 = 0.0;
        do {
          fVar5 = fVar4 * (6.2831855 / fVar3);
          fVar6 = sinf(fVar5);
          fVar5 = cosf(fVar5);
          local_70 = fVar5 * (float)dVar1;
          local_60.x = fVar4 / fVar3;
          local_78._0_4_ = fVar6 * (float)dVar1;
          local_78._4_4_ = (float)dVar9;
          Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_78);
          local_78._4_4_ = local_78._4_4_ * fStack_34;
          local_78._0_4_ = local_78._0_4_ * local_38;
          local_70 = local_70 * local_48;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_78);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_60);
          fVar4 = fVar4 + 1.0;
        } while (fVar4 <= fVar3);
      }
      fVar4 = (float)local_58._0_4_ + 1.0;
    } while (fVar4 < local_64);
  }
  if (fVar8 < fVar2) {
    local_48 = (float)(_resolution + -1);
    local_58 = ZEXT416((uint)(float)(int)(fVar3 + 1.0));
    local_a8 = fVar8;
    do {
      if (fVar3 <= 0.0) {
        fVar4 = local_a8 + 1.0;
      }
      else {
        local_38 = local_a8 + 1.0;
        fVar11 = (local_a8 - fVar8) * (float)local_58._0_4_;
        fVar10 = (local_38 - fVar8) * (float)local_58._0_4_;
        fVar6 = ((local_a8 + 0.0) - fVar8) * (float)local_58._0_4_;
        fVar5 = 0.0;
        do {
          if (0.0 < local_a8) {
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar11 + fVar5));
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar5 + 1.0 + fVar11));
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar10 + fVar5));
          }
          fVar7 = fVar5 + 1.0;
          if (local_a8 < local_48) {
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar6 + fVar7));
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar10 + fVar7));
            Mesh::addIndex(__return_storage_ptr__,(int)(fVar5 + fVar10));
          }
          fVar4 = local_38;
          fVar5 = fVar7;
        } while (fVar7 < fVar3);
      }
      local_a8 = fVar4;
    } while (fVar4 < fVar2);
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh sphereHalfMesh(int _resolution, float _radius ) {
    Mesh mesh;

    float halfRes = _resolution*.5f;
    float doubleRes = _resolution*2.f;
    float polarInc = PI/(_resolution); // ringAngle
    float azimInc = TAU/(doubleRes); // segAngle //
    
    glm::vec3 vert;
    glm::vec2 tcoord;

    for (float i = halfRes; i < _resolution + 1; i++) {
        float tr = sin( PI-i * polarInc);
        float ny = cos( PI-i * polarInc);
        tcoord.y = 1.f - (i / _resolution);

        for (float j = 0; j <= doubleRes; j++) {

            float nx = tr * sin(j * azimInc);
            float nz = tr * cos(j * azimInc);

            tcoord.x = j / (doubleRes);

            vert = {nx, ny, nz};
            mesh.addNormal(vert);

            vert *= _radius;
            mesh.addVertex(vert);
            mesh.addTexCoord(tcoord);
        }
    }

    int nr = doubleRes+1;
    
    int index1, index2, index3;
    for (float iy = halfRes; iy < _resolution; iy++) {
        for (float ix = 0; ix < doubleRes; ix++) {

            // first tri //
            if (iy > 0) {
                index1 = (iy+0-halfRes) * (nr) + (ix+0);
                index2 = (iy+0-halfRes) * (nr) + (ix+1);
                index3 = (iy+1-halfRes) * (nr) + (ix+0);

                mesh.addIndex(index1);
                mesh.addIndex(index2);
                mesh.addIndex(index3);
            }

            if (iy < _resolution - 1 ) {
                // second tri //
                index1 = (iy+0-halfRes) * (nr) + (ix+1);
                index2 = (iy+1-halfRes) * (nr) + (ix+1);
                index3 = (iy+1-halfRes) * (nr) + (ix+0);

                mesh.addIndex(index1);
                mesh.addIndex(index2);
                mesh.addIndex(index3);

            }
        }
    }
    mesh.computeTangents();

    return mesh;
}